

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandAssign.cpp
# Opt level: O2

string * __thiscall
CommandAssign::describe_abi_cxx11_(string *__return_storage_ptr__,CommandAssign *this)

{
  string sStack_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  AST::describe_abi_cxx11_(&local_38,(AST *)this);
  std::operator+(&local_98,&local_38," ");
  Expression::describe_abi_cxx11_(&local_b8,&this->super_Expression);
  std::operator+(&local_78,&local_98,&local_b8);
  std::operator+(&local_58,&local_78," ");
  VarName::describe_abi_cxx11_(&sStack_d8,&this->super_VarName);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandAssign::describe() {
    return Command::describe() + " " + Expression::describe() + " " + VarName::describe();
}